

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O2

void __thiscall
BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
          (BayesianGameForDecPOMDPStage *this,BayesianGameForDecPOMDPStage *o)

{
  QFunctionJAOHInterface *pQVar1;
  const_reference ppJVar2;
  value_type pJVar3;
  reference ppJVar4;
  uint uVar5;
  ulong __n;
  allocator_type local_61;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_60;
  BayesianGameIdenticalPayoff *local_58;
  value_type local_50;
  _Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> local_48;
  
  BayesianGameForDecPOMDPStageInterface::BayesianGameForDecPOMDPStageInterface
            (&this->super_BayesianGameForDecPOMDPStageInterface,
             &o->super_BayesianGameForDecPOMDPStageInterface);
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (&this->super_BayesianGameIdenticalPayoff,&o->super_BayesianGameIdenticalPayoff);
  (this->super_BayesianGameForDecPOMDPStageInterface)._vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005d8458;
  (this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005d84a8;
  pQVar1 = o->_m_qHeuristic;
  this->_m_pu = o->_m_pu;
  this->_m_qHeuristic = pQVar1;
  (this->_m_JBs).super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_JBs).super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (this->_m_JBs).super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  this->_m_areCachedImmediateRewards = o->_m_areCachedImmediateRewards;
  local_58 = &this->super_BayesianGameIdenticalPayoff;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_m_immR,&o->_m_immR);
  local_50 = (value_type)0x0;
  local_60 = &this->_m_immR;
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)&local_48,
             (long)(o->_m_JBs).
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(o->_m_JBs).
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_50,&local_61);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::_M_move_assign
            (&this->_m_JBs,&local_48);
  std::_Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::~_Vector_base
            (&local_48);
  for (uVar5 = 0; __n = (ulong)uVar5,
      (long)(o->_m_JBs).
            super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(o->_m_JBs).
            super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != __n; uVar5 = uVar5 + 1) {
    ppJVar2 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                        (&o->_m_JBs,__n);
    if (*ppJVar2 != (value_type)0x0) {
      ppJVar2 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                          (&o->_m_JBs,__n);
      pJVar3 = (value_type)(**(code **)((long)**ppJVar2 + 0xb8))();
      ppJVar4 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                          (&this->_m_JBs,__n);
      *ppJVar4 = pJVar3;
    }
  }
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage(const BayesianGameForDecPOMDPStage& o) 
    :
        BayesianGameForDecPOMDPStageInterface( o ),
        //BayesianGameBase( o ),
        BayesianGameIdenticalPayoff ( o )
        ,_m_pu(o._m_pu)
        ,_m_qHeuristic(o._m_qHeuristic)
        ,_m_areCachedImmediateRewards(o._m_areCachedImmediateRewards)
        ,_m_immR(o._m_immR) //does this work for std::vector< std::vector<double> > ? gues so?
{
    //make deep copy of beliefs in _m_JB
    _m_JBs=std::vector< JointBeliefInterface* >(o._m_JBs.size(),0);
    for(Index k=0;k!=o._m_JBs.size();++k)
    {
        if(o._m_JBs.at(k))
            _m_JBs.at(k)=o._m_JBs.at(k)->Clone();
    }
}